

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.h
# Opt level: O0

int __thiscall
rlib::sequencer::MmlCompiler::EventPan::clone
          (EventPan *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  shared_ptr<rlib::sequencer::MmlCompiler::EventPan> *in_stack_ffffffffffffffc8;
  EventPan *this_00;
  
  this_00 = this;
  std::
  make_shared<rlib::sequencer::MmlCompiler::EventPan,rlib::sequencer::MmlCompiler::EventPan_const&>
            (this);
  std::shared_ptr<rlib::sequencer::MmlCompiler::Event>::
  shared_ptr<rlib::sequencer::MmlCompiler::EventPan,void>
            ((shared_ptr<rlib::sequencer::MmlCompiler::Event> *)this_00,in_stack_ffffffffffffffc8);
  std::shared_ptr<rlib::sequencer::MmlCompiler::EventPan>::~shared_ptr
            ((shared_ptr<rlib::sequencer::MmlCompiler::EventPan> *)0x17b823);
  return (int)this;
}

Assistant:

virtual std::shared_ptr<Event> clone()const {
				return std::make_shared<EventPan>(*this);
			}